

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::Generate
          (ImmutableMessageGenerator *this,Printer *printer)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  mapped_type *pmVar9;
  string *psVar10;
  ImmutableFieldGenerator *pIVar11;
  OneofGeneratorInfo *pOVar12;
  OneofDescriptor *pOVar13;
  Context *context;
  FileDescriptor *text;
  int __c;
  Printer *in_RSI;
  char *__s;
  long in_RDI;
  int i_6;
  int i_5;
  FieldDescriptor *field_1;
  int j_1;
  FieldDescriptor *field;
  int j;
  int i_4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  int i_3;
  int totalInts;
  int i_2;
  int totalBits;
  ImmutableMessageGenerator messageGenerator;
  int i_1;
  int i;
  string builder_type;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  bool is_own_file;
  string *in_stack_fffffffffffff1d8;
  Printer *in_stack_fffffffffffff1e0;
  Context *this_00;
  ClassNameResolver *in_stack_fffffffffffff1e8;
  SubstituteArg *this_01;
  Printer *pPVar14;
  ImmutableMessageGenerator *this_02;
  Printer *in_stack_fffffffffffff208;
  undefined4 in_stack_fffffffffffff210;
  undefined4 in_stack_fffffffffffff214;
  AlphaNum *in_stack_fffffffffffff218;
  Printer *in_stack_fffffffffffff220;
  undefined4 in_stack_fffffffffffff228;
  JavaType in_stack_fffffffffffff22c;
  Context *in_stack_fffffffffffff230;
  Printer *in_stack_fffffffffffff238;
  undefined7 in_stack_fffffffffffff240;
  undefined1 in_stack_fffffffffffff247;
  FieldDescriptor *in_stack_fffffffffffff248;
  Context *in_stack_fffffffffffff250;
  Context *in_stack_fffffffffffff258;
  Context *in_stack_fffffffffffff260;
  EnumDescriptor *in_stack_fffffffffffff268;
  EnumGenerator *in_stack_fffffffffffff270;
  undefined7 in_stack_fffffffffffff278;
  undefined1 in_stack_fffffffffffff27f;
  ImmutableExtensionGenerator *in_stack_fffffffffffff280;
  SubstituteArg *in_stack_fffffffffffff288;
  SubstituteArg *in_stack_fffffffffffff290;
  undefined4 in_stack_fffffffffffff298;
  int in_stack_fffffffffffff29c;
  Printer *in_stack_fffffffffffff2a0;
  SubstituteArg *in_stack_fffffffffffff2a8;
  char (*in_stack_fffffffffffff2b0) [13];
  undefined4 in_stack_fffffffffffff2b8;
  undefined4 in_stack_fffffffffffff2bc;
  Printer *in_stack_fffffffffffff348;
  FieldOptions *in_stack_fffffffffffff350;
  undefined4 in_stack_fffffffffffff368;
  undefined4 in_stack_fffffffffffff36c;
  ImmutableMessageGenerator *in_stack_fffffffffffff370;
  Printer *in_stack_fffffffffffff398;
  ImmutableMessageGenerator *in_stack_fffffffffffff3a0;
  Printer *in_stack_fffffffffffff3a8;
  string *psVar15;
  ImmutableMessageGenerator *in_stack_fffffffffffff3b0;
  allocator *paVar16;
  char *in_stack_fffffffffffff3c0;
  char *text_00;
  Printer *in_stack_fffffffffffff3c8;
  Printer *in_stack_fffffffffffff3d0;
  int local_a7c;
  string local_a78 [32];
  char *local_a58;
  string local_a50 [32];
  string local_a30 [32];
  string local_a10 [32];
  string local_9f0 [80];
  string local_9a0 [32];
  string local_980 [32];
  int local_960;
  allocator local_959;
  string local_958 [32];
  string local_938 [32];
  string local_918 [80];
  string local_8c8 [32];
  FieldDescriptor *local_8a8;
  int local_8a0;
  allocator local_899;
  string local_898 [32];
  string local_878 [80];
  undefined1 local_828 [64];
  char *local_7e8;
  _Base_ptr local_7e0;
  int local_7d8;
  allocator local_7d1;
  string local_7d0 [80];
  string local_780 [39];
  allocator local_759;
  string local_758 [39];
  allocator local_731;
  string local_730 [36];
  uint local_70c;
  string local_6d8 [32];
  int local_6b8;
  int local_6b4;
  int local_6b0;
  int local_6ac;
  int local_664;
  Printer *in_stack_fffffffffffff9d8;
  EnumGenerator *in_stack_fffffffffffff9e0;
  int local_60c;
  undefined1 local_608 [48];
  undefined1 local_5d8 [96];
  SubstituteArg local_578;
  undefined1 local_548 [96];
  SubstituteArg local_4e8;
  SubstituteArg local_4b8;
  SubstituteArg local_488;
  string local_458 [80];
  string local_408 [32];
  undefined1 local_3e8 [48];
  undefined1 local_3b8 [96];
  SubstituteArg local_358;
  undefined1 local_328 [96];
  SubstituteArg local_2c8;
  SubstituteArg local_298;
  string local_268 [80];
  string local_218 [80];
  string local_1c8 [32];
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [80];
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar2 = IsOwnFile<google::protobuf::Descriptor>
                    ((Descriptor *)in_stack_fffffffffffff1e0,
                     SUB81((ulong)in_stack_fffffffffffff1d8 >> 0x38,0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x53ad09);
  pcVar8 = " static ";
  if ((bVar2 & 1) != 0) {
    pcVar8 = " ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"static",&local_69);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff220,(key_type *)in_stack_fffffffffffff218);
  std::__cxx11::string::operator=((string *)pmVar9,pcVar8);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  psVar10 = Descriptor::name_abi_cxx11_(*(Descriptor **)(in_RDI + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"classname",&local_a1);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff220,(key_type *)in_stack_fffffffffffff218);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)psVar10);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  ExtraMessageInterfaces_abi_cxx11_
            ((Descriptor *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"extra_interfaces",&local_e9);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff220,(key_type *)in_stack_fffffffffffff218);
  std::__cxx11::string::operator=((string *)pmVar9,local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string(local_c8);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"ver",&local_131);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff220,(key_type *)in_stack_fffffffffffff218);
  std::__cxx11::string::operator=((string *)pmVar9,local_110);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_110);
  Descriptor::options(*(Descriptor **)(in_RDI + 8));
  bVar3 = MessageOptions::deprecated((MessageOptions *)0x53afcc);
  pcVar8 = "";
  if (bVar3) {
    pcVar8 = "@java.lang.Deprecated ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"deprecation",&local_159);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff220,(key_type *)in_stack_fffffffffffff218);
  std::__cxx11::string::operator=((string *)pmVar9,pcVar8);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  WriteMessageDocComment(in_stack_fffffffffffff220,(Descriptor *)in_stack_fffffffffffff218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"",&local_181);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (in_stack_fffffffffffff230,
             (Printer *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228),
             (Descriptor *)in_stack_fffffffffffff220,
             SUB81((ulong)in_stack_fffffffffffff218 >> 0x38,0),
             (string *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::string(local_1a8);
  iVar6 = Descriptor::extension_range_count(*(Descriptor **)(in_RDI + 8));
  if (iVar6 < 1) {
    io::Printer::Print(in_stack_fffffffffffff3d0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0);
    io::Printer::Annotate<google::protobuf::Descriptor>
              (in_stack_fffffffffffff1e0,(char *)in_stack_fffffffffffff1d8,(Descriptor *)0x53b5f3);
    io::Printer::Print(in_stack_fffffffffffff3d0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0);
    GeneratedCodeVersionSuffix_abi_cxx11_();
    strings::internal::SubstituteArg::SubstituteArg
              ((SubstituteArg *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
    strings::internal::SubstituteArg::SubstituteArg(&local_488);
    strings::internal::SubstituteArg::SubstituteArg(&local_4b8);
    strings::internal::SubstituteArg::SubstituteArg(&local_4e8);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_548 + 0x30));
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_548);
    strings::internal::SubstituteArg::SubstituteArg(&local_578);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_5d8 + 0x30));
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_5d8);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_608);
    this_02 = (ImmutableMessageGenerator *)local_608;
    pPVar14 = (Printer *)local_5d8;
    this_01 = &local_578;
    this_00 = (Context *)local_548;
    pcVar8 = local_548 + 0x30;
    strings::Substitute_abi_cxx11_
              ((char *)in_stack_fffffffffffff248,
               (SubstituteArg *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
               (SubstituteArg *)in_stack_fffffffffffff238,(SubstituteArg *)in_stack_fffffffffffff230
               ,(SubstituteArg *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228),
               (SubstituteArg *)in_stack_fffffffffffff280,in_stack_fffffffffffff288,
               in_stack_fffffffffffff290,
               (SubstituteArg *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (SubstituteArg *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff2a8);
    std::__cxx11::string::operator=(local_1a8,local_408);
    std::__cxx11::string::~string(local_408);
    std::__cxx11::string::~string(local_458);
  }
  else {
    io::Printer::Print(in_stack_fffffffffffff3d0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0);
    io::Printer::Annotate<google::protobuf::Descriptor>
              (in_stack_fffffffffffff1e0,(char *)in_stack_fffffffffffff1d8,(Descriptor *)0x53b1b5);
    io::Printer::Print(in_stack_fffffffffffff3d0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (in_stack_fffffffffffff1e8,(Descriptor *)in_stack_fffffffffffff1e0);
    strings::internal::SubstituteArg::SubstituteArg
              ((SubstituteArg *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
    GeneratedCodeVersionSuffix_abi_cxx11_();
    strings::internal::SubstituteArg::SubstituteArg
              ((SubstituteArg *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
    strings::internal::SubstituteArg::SubstituteArg(&local_298);
    strings::internal::SubstituteArg::SubstituteArg(&local_2c8);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_328 + 0x30));
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_328);
    strings::internal::SubstituteArg::SubstituteArg(&local_358);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_3b8 + 0x30));
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_3b8);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_3e8);
    this_02 = (ImmutableMessageGenerator *)local_3e8;
    pPVar14 = (Printer *)local_3b8;
    this_01 = &local_358;
    this_00 = (Context *)local_328;
    pcVar8 = local_328 + 0x30;
    strings::Substitute_abi_cxx11_
              ((char *)in_stack_fffffffffffff248,
               (SubstituteArg *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
               (SubstituteArg *)in_stack_fffffffffffff238,(SubstituteArg *)in_stack_fffffffffffff230
               ,(SubstituteArg *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228),
               (SubstituteArg *)in_stack_fffffffffffff280,in_stack_fffffffffffff288,
               in_stack_fffffffffffff290,
               (SubstituteArg *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (SubstituteArg *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff2a8);
    std::__cxx11::string::operator=(local_1a8,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_218);
  }
  io::Printer::Print<>
            ((Printer *)in_stack_fffffffffffff230,
             (char *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  io::Printer::Indent((Printer *)0x53b7ba);
  Descriptor::name_abi_cxx11_(*(Descriptor **)(in_RDI + 8));
  io::Printer::Print<char[10],std::__cxx11::string,char[12],std::__cxx11::string>
            ((Printer *)in_stack_fffffffffffff250,(char *)in_stack_fffffffffffff248,
             (char (*) [10])CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff238,(char (*) [12])in_stack_fffffffffffff230,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  Descriptor::name_abi_cxx11_(*(Descriptor **)(in_RDI + 8));
  io::Printer::Print<char[10],std::__cxx11::string>
            ((Printer *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             &in_stack_fffffffffffff238->variable_delimiter_,
             (char (*) [10])in_stack_fffffffffffff230,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  io::Printer::Indent((Printer *)0x53b878);
  GenerateInitializers(this_02,pPVar14);
  io::Printer::Outdent((Printer *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240));
  io::Printer::Print<>
            ((Printer *)in_stack_fffffffffffff230,
             (char *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  io::Printer::Print(in_stack_fffffffffffff3d0,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0);
  io::Printer::Print<>
            ((Printer *)in_stack_fffffffffffff230,
             (char *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  bVar3 = Context::HasGeneratedMethods(this_00,(Descriptor *)pcVar8);
  if (bVar3) {
    GenerateParsingConstructor(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
  }
  GenerateDescriptorMethods
            ((ImmutableMessageGenerator *)in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  for (local_60c = 0; iVar6 = Descriptor::enum_type_count(*(Descriptor **)(in_RDI + 8)),
      local_60c < iVar6; local_60c = local_60c + 1) {
    Descriptor::enum_type(*(Descriptor **)(in_RDI + 8),local_60c);
    EnumGenerator::EnumGenerator
              (in_stack_fffffffffffff270,in_stack_fffffffffffff268,
               SUB81((ulong)in_stack_fffffffffffff260 >> 0x38,0),in_stack_fffffffffffff258);
    EnumGenerator::Generate(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    EnumGenerator::~EnumGenerator((EnumGenerator *)this_00);
  }
  for (local_664 = 0; iVar6 = local_664,
      iVar7 = Descriptor::nested_type_count(*(Descriptor **)(in_RDI + 8)), iVar6 < iVar7;
      local_664 = local_664 + 1) {
    Descriptor::nested_type(*(Descriptor **)(in_RDI + 8),local_664);
    bVar3 = IsMapEntry((Descriptor *)0x53bab0);
    if (!bVar3) {
      Descriptor::nested_type(*(Descriptor **)(in_RDI + 8),local_664);
      ImmutableMessageGenerator
                ((ImmutableMessageGenerator *)in_stack_fffffffffffff270,
                 (Descriptor *)in_stack_fffffffffffff268,in_stack_fffffffffffff260);
      GenerateInterface(in_stack_fffffffffffff370,
                        (Printer *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
      Generate((ImmutableMessageGenerator *)in_RSI,
               (Printer *)CONCAT17(bVar2,in_stack_ffffffffffffffe8));
      ~ImmutableMessageGenerator((ImmutableMessageGenerator *)this_00);
    }
  }
  local_6ac = 0;
  for (local_6b0 = 0; iVar6 = local_6b0,
      iVar7 = Descriptor::field_count(*(Descriptor **)(in_RDI + 8)), iVar6 < iVar7;
      local_6b0 = local_6b0 + 1) {
    Descriptor::field(*(Descriptor **)(in_RDI + 8),local_6b0);
    pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                        ((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
                          *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
    iVar6 = (*pIVar11->_vptr_ImmutableFieldGenerator[2])();
    local_6ac = iVar6 + local_6ac;
  }
  local_6b4 = (local_6ac + 0x1f) / 0x20;
  for (local_6b8 = 0; local_6b8 < local_6b4; local_6b8 = local_6b8 + 1) {
    GetBitFieldName_abi_cxx11_((int)((ulong)in_stack_fffffffffffff248 >> 0x20));
    io::Printer::Print<char[15],std::__cxx11::string>
              ((Printer *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
               &in_stack_fffffffffffff238->variable_delimiter_,
               (char (*) [15])in_stack_fffffffffffff230,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
    std::__cxx11::string::~string(local_6d8);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x53bd46);
  for (local_70c = 0; uVar1 = local_70c,
      iVar6 = Descriptor::oneof_decl_count(*(Descriptor **)(in_RDI + 8)), (int)uVar1 < iVar6;
      local_70c = local_70c + 1) {
    Descriptor::oneof_decl(*(Descriptor **)(in_RDI + 8),local_70c);
    pOVar12 = Context::GetOneofGeneratorInfo
                        (in_stack_fffffffffffff250,(OneofDescriptor *)in_stack_fffffffffffff248);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_730,"oneof_name",&local_731);
    in_stack_fffffffffffff3d0 =
         (Printer *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff220,(key_type *)in_stack_fffffffffffff218);
    std::__cxx11::string::operator=((string *)in_stack_fffffffffffff3d0,(string *)pOVar12);
    std::__cxx11::string::~string(local_730);
    std::allocator<char>::~allocator((allocator<char> *)&local_731);
    text_00 = *(char **)(in_RDI + 0x10);
    in_stack_fffffffffffff3c8 =
         (Printer *)Descriptor::oneof_decl(*(Descriptor **)(in_RDI + 8),local_70c);
    pOVar12 = Context::GetOneofGeneratorInfo
                        (in_stack_fffffffffffff250,(OneofDescriptor *)in_stack_fffffffffffff248);
    psVar15 = (string *)&pOVar12->capitalized_name;
    paVar16 = &local_759;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_758,"oneof_capitalized_name",paVar16);
    in_stack_fffffffffffff3a0 =
         (ImmutableMessageGenerator *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff220,(key_type *)in_stack_fffffffffffff218);
    std::__cxx11::string::operator=((string *)in_stack_fffffffffffff3a0,psVar15);
    std::__cxx11::string::~string(local_758);
    std::allocator<char>::~allocator((allocator<char> *)&local_759);
    __s = (char *)(ulong)local_70c;
    in_stack_fffffffffffff398 =
         (Printer *)Descriptor::oneof_decl(*(Descriptor **)(in_RDI + 8),local_70c);
    OneofDescriptor::index((OneofDescriptor *)in_stack_fffffffffffff398,__s,__c);
    strings::AlphaNum::AlphaNum((AlphaNum *)this_00,(int)((ulong)pcVar8 >> 0x20));
    StrCat_abi_cxx11_(in_stack_fffffffffffff218);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7d0,"oneof_index",&local_7d1);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffff220,(key_type *)in_stack_fffffffffffff218);
    std::__cxx11::string::operator=((string *)pmVar9,local_780);
    std::__cxx11::string::~string(local_7d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
    std::__cxx11::string::~string(local_780);
    io::Printer::Print(in_stack_fffffffffffff3d0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff3c8,text_00);
    io::Printer::Print(in_stack_fffffffffffff3d0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff3c8,text_00);
    io::Printer::Indent((Printer *)0x53c097);
    local_7d8 = 0;
    while( true ) {
      iVar6 = local_7d8;
      pOVar13 = Descriptor::oneof_decl(*(Descriptor **)(in_RDI + 8),local_70c);
      iVar7 = OneofDescriptor::field_count(pOVar13);
      if (iVar7 <= iVar6) break;
      pOVar13 = Descriptor::oneof_decl(*(Descriptor **)(in_RDI + 8),local_70c);
      iVar6 = (int)((ulong)pcVar8 >> 0x20);
      in_stack_fffffffffffff348 = in_RSI;
      local_7e0 = (_Base_ptr)OneofDescriptor::field(pOVar13,local_7d8);
      in_RSI = in_stack_fffffffffffff348;
      in_stack_fffffffffffff350 = FieldDescriptor::options((FieldDescriptor *)local_7e0);
      bVar3 = FieldOptions::deprecated((FieldOptions *)0x53c184);
      local_7e8 = "";
      if (bVar3) {
        local_7e8 = "@java.lang.Deprecated ";
      }
      FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)local_7e0);
      ToUpper((string *)pPVar14);
      FieldDescriptor::number((FieldDescriptor *)local_7e0);
      strings::AlphaNum::AlphaNum((AlphaNum *)this_00,iVar6);
      StrCat_abi_cxx11_(in_stack_fffffffffffff218);
      this_00 = (Context *)local_828;
      pcVar8 = "field_number";
      io::Printer::
      Print<char[12],char_const*,char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                (in_stack_fffffffffffff2a0,
                 (char *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
                 (char (*) [12])in_stack_fffffffffffff290,&in_stack_fffffffffffff288->text_,
                 (char (*) [11])in_stack_fffffffffffff280,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
                 in_stack_fffffffffffff2b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
      std::__cxx11::string::~string((string *)local_828);
      std::__cxx11::string::~string((string *)(local_828 + 0x20));
      local_7d8 = local_7d8 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_898,"oneof_name",&local_899);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff220,(key_type *)in_stack_fffffffffffff218);
    ToUpper((string *)pPVar14);
    io::Printer::Print<char[15],std::__cxx11::string>
              ((Printer *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
               &in_stack_fffffffffffff238->variable_delimiter_,
               (char (*) [15])in_stack_fffffffffffff230,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
    std::__cxx11::string::~string(local_878);
    std::__cxx11::string::~string(local_898);
    std::allocator<char>::~allocator((allocator<char> *)&local_899);
    io::Printer::Print(in_stack_fffffffffffff3d0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff3c8,text_00);
    io::Printer::Print(in_stack_fffffffffffff3d0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff3c8,text_00);
    local_8a0 = 0;
    while( true ) {
      iVar6 = local_8a0;
      pOVar13 = Descriptor::oneof_decl(*(Descriptor **)(in_RDI + 8),local_70c);
      iVar7 = OneofDescriptor::field_count(pOVar13);
      if (iVar7 <= iVar6) break;
      pOVar13 = Descriptor::oneof_decl(*(Descriptor **)(in_RDI + 8),local_70c);
      local_8a8 = OneofDescriptor::field(pOVar13,local_8a0);
      FieldDescriptor::number(local_8a8);
      strings::AlphaNum::AlphaNum((AlphaNum *)this_00,(int)((ulong)pcVar8 >> 0x20));
      StrCat_abi_cxx11_(in_stack_fffffffffffff218);
      FieldDescriptor::name_abi_cxx11_(local_8a8);
      ToUpper((string *)pPVar14);
      io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                ((Printer *)in_stack_fffffffffffff250,(char *)in_stack_fffffffffffff248,
                 (char (*) [13])CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff238,(char (*) [11])in_stack_fffffffffffff230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
      std::__cxx11::string::~string(local_918);
      std::__cxx11::string::~string(local_8c8);
      local_8a0 = local_8a0 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_958,"oneof_name",&local_959);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff220,(key_type *)in_stack_fffffffffffff218);
    ToUpper((string *)pPVar14);
    io::Printer::Print<char[15],std::__cxx11::string>
              ((Printer *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
               &in_stack_fffffffffffff238->variable_delimiter_,
               (char (*) [15])in_stack_fffffffffffff230,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
    std::__cxx11::string::~string(local_938);
    std::__cxx11::string::~string(local_958);
    std::allocator<char>::~allocator((allocator<char> *)&local_959);
    io::Printer::Outdent((Printer *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240));
    io::Printer::Print<>
              ((Printer *)in_stack_fffffffffffff230,
               (char *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
    io::Printer::Print(in_stack_fffffffffffff3d0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff3c8,text_00);
  }
  bVar3 = IsAnyMessage((Descriptor *)0x53c8d8);
  if (bVar3) {
    GenerateAnyMethods((ImmutableMessageGenerator *)this_00,(Printer *)pcVar8);
  }
  local_960 = 0;
  while (iVar6 = local_960, iVar7 = Descriptor::field_count(*(Descriptor **)(in_RDI + 8)),
        iVar6 < iVar7) {
    Descriptor::field(*(Descriptor **)(in_RDI + 8),local_960);
    FieldConstantName_abi_cxx11_((FieldDescriptor *)pPVar14);
    in_stack_fffffffffffff2a0 = (Printer *)Descriptor::field(*(Descriptor **)(in_RDI + 8),local_960)
    ;
    in_stack_fffffffffffff29c =
         FieldDescriptor::number((FieldDescriptor *)in_stack_fffffffffffff2a0);
    strings::AlphaNum::AlphaNum((AlphaNum *)this_00,(int)((ulong)pcVar8 >> 0x20));
    StrCat_abi_cxx11_(in_stack_fffffffffffff218);
    io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
              ((Printer *)in_stack_fffffffffffff250,(char *)in_stack_fffffffffffff248,
               (char (*) [14])CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff238,(char (*) [7])in_stack_fffffffffffff230,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
    std::__cxx11::string::~string(local_9a0);
    std::__cxx11::string::~string(local_980);
    Descriptor::field(*(Descriptor **)(in_RDI + 8),local_960);
    in_stack_fffffffffffff280 =
         (ImmutableExtensionGenerator *)
         FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                   ((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)
                    in_stack_fffffffffffff250,in_stack_fffffffffffff248);
    (*(in_stack_fffffffffffff280->super_ExtensionGenerator)._vptr_ExtensionGenerator[5])
              (in_stack_fffffffffffff280,in_RSI);
    io::Printer::Print<>
              ((Printer *)in_stack_fffffffffffff230,
               (char *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
    local_960 = local_960 + 1;
  }
  uVar4 = Context::HasGeneratedMethods(this_00,(Descriptor *)pcVar8);
  if ((bool)uVar4) {
    GenerateIsInitialized
              ((ImmutableMessageGenerator *)in_stack_fffffffffffff350,in_stack_fffffffffffff348);
    GenerateMessageSerializationMethods
              ((ImmutableMessageGenerator *)in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
    GenerateEqualsAndHashCode(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
  }
  GenerateParseFromMethods
            ((ImmutableMessageGenerator *)in_stack_fffffffffffff230,
             (Printer *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  GenerateBuilder((ImmutableMessageGenerator *)in_stack_fffffffffffff2a0,
                  (Printer *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298));
  context = (Context *)Descriptor::full_name_abi_cxx11_(*(Descriptor **)(in_RDI + 8));
  io::Printer::Print<char[10],std::__cxx11::string>
            ((Printer *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             &in_stack_fffffffffffff238->variable_delimiter_,
             (char (*) [10])in_stack_fffffffffffff230,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((ClassNameResolver *)this_01,(Descriptor *)this_00);
  io::Printer::Print<char[10],std::__cxx11::string>
            ((Printer *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             &in_stack_fffffffffffff238->variable_delimiter_,
             (char (*) [10])in_stack_fffffffffffff230,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::__cxx11::string::~string(local_9f0);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((ClassNameResolver *)this_01,(Descriptor *)this_00);
  io::Printer::Print<char[10],std::__cxx11::string>
            ((Printer *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             &in_stack_fffffffffffff238->variable_delimiter_,
             (char (*) [10])in_stack_fffffffffffff230,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::__cxx11::string::~string(local_a10);
  pPVar14 = in_RSI;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((ClassNameResolver *)this_01,(Descriptor *)this_00);
  io::Printer::Print<char[10],std::__cxx11::string>
            ((Printer *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             &in_stack_fffffffffffff238->variable_delimiter_,
             (char (*) [10])in_stack_fffffffffffff230,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::__cxx11::string::~string(local_a30);
  text = Descriptor::file(*(Descriptor **)(in_RDI + 8));
  uVar5 = IsWrappersProtoFile((FileDescriptor *)0x53cd5d);
  if ((bool)uVar5) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((ClassNameResolver *)this_01,(Descriptor *)this_00);
    in_stack_fffffffffffff230 = (Context *)Descriptor::field(*(Descriptor **)(in_RDI + 8),0);
    in_stack_fffffffffffff22c = GetJavaType((FieldDescriptor *)pPVar14);
    local_a58 = PrimitiveTypeName((JavaType)((ulong)pPVar14 >> 0x20));
    io::Printer::Print<char[10],std::__cxx11::string,char[11],char_const*>
              (in_RSI,(char *)text,(char (*) [10])CONCAT17(uVar5,in_stack_fffffffffffff240),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar14,
               (char (*) [11])in_stack_fffffffffffff230,
               (char **)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
    std::__cxx11::string::~string(local_a50);
    in_stack_fffffffffffff238 = pPVar14;
  }
  GenerateParser((ImmutableMessageGenerator *)
                 CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
                 in_stack_fffffffffffff208);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((ClassNameResolver *)this_01,(Descriptor *)this_00);
  io::Printer::Print<char[10],std::__cxx11::string>
            ((Printer *)CONCAT17(uVar5,in_stack_fffffffffffff240),
             &in_stack_fffffffffffff238->variable_delimiter_,
             (char (*) [10])in_stack_fffffffffffff230,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::__cxx11::string::~string(local_a78);
  local_a7c = 0;
  while (iVar6 = local_a7c, iVar7 = Descriptor::extension_count(*(Descriptor **)(in_RDI + 8)),
        iVar6 < iVar7) {
    Descriptor::extension(*(Descriptor **)(in_RDI + 8),local_a7c);
    ImmutableExtensionGenerator::ImmutableExtensionGenerator
              (in_stack_fffffffffffff280,
               (FieldDescriptor *)CONCAT17(uVar4,in_stack_fffffffffffff278),context);
    ImmutableExtensionGenerator::Generate
              ((ImmutableExtensionGenerator *)CONCAT17(uVar5,in_stack_fffffffffffff240),
               in_stack_fffffffffffff238);
    ImmutableExtensionGenerator::~ImmutableExtensionGenerator
              ((ImmutableExtensionGenerator *)this_00);
    local_a7c = local_a7c + 1;
  }
  io::Printer::Outdent((Printer *)CONCAT17(uVar5,in_stack_fffffffffffff240));
  io::Printer::Print<>
            ((Printer *)in_stack_fffffffffffff230,
             (char *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x53d05e);
  std::__cxx11::string::~string(local_1a8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x53d078);
  return;
}

Assistant:

void ImmutableMessageGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<std::string, std::string> variables;
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["ver"] = GeneratedCodeVersionSuffix();
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);

  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(
        variables,
        "    com.google.protobuf.GeneratedMessage$ver$.ExtendableMessage<\n"
        "      $classname$> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_),
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(variables,
                   "    com.google.protobuf.GeneratedMessage$ver$ implements\n"
                   "    $extra_interfaces$\n"
                   "    $classname$OrBuilder {\n");
    builder_type =
        strings::Substitute("com.google.protobuf.GeneratedMessage$0.Builder<?>",
                            GeneratedCodeVersionSuffix());
  }
  printer->Print("private static final long serialVersionUID = 0L;\n");

  printer->Indent();
  // Using builder_type, instead of Builder, prevents the Builder class from
  // being loaded into PermGen space when the default instance is created.
  // This optimizes the PermGen space usage for clients that do not modify
  // messages.
  printer->Print(
      "// Use $classname$.newBuilder() to construct.\n"
      "private $classname$($buildertype$ builder) {\n"
      "  super(builder);\n"
      "}\n",
      "classname", descriptor_->name(), "buildertype", builder_type);
  printer->Print("private $classname$() {\n", "classname", descriptor_->name());
  printer->Indent();
  GenerateInitializers(printer);
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(variables,
                 "@java.lang.Override\n"
                 "@SuppressWarnings({\"unused\"})\n"
                 "protected java.lang.Object newInstance(\n"
                 "    UnusedPrivateParameter unused) {\n"
                 "  return new $classname$();\n"
                 "}\n"
                 "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public final com.google.protobuf.UnknownFieldSet\n"
      "getUnknownFields() {\n"
      "  return this.unknownFields;\n"
      "}\n");

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateParsingConstructor(printer);
  }

  GenerateDescriptorMethods(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator(descriptor_->enum_type(i), true, context_).Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageGenerator messageGenerator(descriptor_->nested_type(i),
                                               context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  std::map<std::string, std::string> vars;
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    vars["oneof_name"] =
        context_->GetOneofGeneratorInfo(descriptor_->oneof_decl(i))->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(descriptor_->oneof_decl(i))
            ->capitalized_name;
    vars["oneof_index"] = StrCat(descriptor_->oneof_decl(i)->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(
        vars,
        "public enum $oneof_capitalized_name$Case\n"
        // TODO(dweis): Remove EnumLite when we want to break compatibility with
        // 3.x users
        "    implements com.google.protobuf.Internal.EnumLite,\n"
        "        com.google.protobuf.AbstractMessage.InternalOneOfEnum {\n");
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
          "$deprecation$$field_name$($field_number$),\n", "deprecation",
          field->options().deprecated() ? "@java.lang.Deprecated " : "",
          "field_name", ToUpper(field->name()), "field_number",
          StrCat(field->number()));
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   ToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    printer->Print(
        vars,
        "/**\n"
        " * @param value The number of the enum to look for.\n"
        " * @return The enum associated with the given number.\n"
        " * @deprecated Use {@link #forNumber(int)} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
        "  return forNumber(value);\n"
        "}\n"
        "\n"
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", StrCat(field->number()),
                     "field_name", ToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "public $oneof_capitalized_name$Case\n"
                   "get$oneof_capitalized_name$Case() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n");
  }

  if (IsAnyMessage(descriptor_)) {
    GenerateAnyMethods(printer);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", StrCat(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateMessageSerializationMethods(printer);
    GenerateEqualsAndHashCode(printer);
  }


  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));
  printer->Print(
      "static {\n"
      "  DEFAULT_INSTANCE = new $classname$();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ getDefaultInstanceForType() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}